

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManPrintRepr(Gia_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = p->nObjs;
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->pReprsOld[uVar2] != -1) {
        printf("%d->%d ",uVar2 & 0xffffffff,(ulong)((uint)p->pReprs[uVar2] & 0xfffffff));
        iVar1 = p->nObjs;
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)iVar1);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManPrintRepr( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        if ( ~p->pReprsOld[i] )
            printf( "%d->%d ", i, p->pReprs[i].iRepr );
    printf( "\n" );
}